

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

string * __thiscall
wasm::HeapType::toString_abi_cxx11_(string *__return_storage_ptr__,HeapType *this)

{
  HeapType *this_local;
  
  genericToString<wasm::HeapType>(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

std::string HeapType::toString() const { return genericToString(*this); }